

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_copy_key(psa_key_handle_t source_handle,psa_key_attributes_t *specified_attributes,
            psa_key_handle_t *target_handle)

{
  psa_algorithm_t alg2;
  psa_algorithm_t alg2_00;
  bool bVar1;
  psa_key_slot_t *source;
  psa_algorithm_t pVar2;
  psa_status_t pVar3;
  psa_algorithm_t pVar4;
  psa_algorithm_t pVar5;
  psa_key_slot_t *driver_00;
  psa_se_drv_table_entry_t **in_R8;
  psa_key_slot_t *target_slot;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *source_slot;
  psa_key_attributes_t actual_attributes;
  psa_key_slot_t *local_88;
  psa_algorithm_t local_7c;
  psa_key_slot_t *local_78;
  psa_key_slot_t *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  void *local_48;
  size_t sStack_40;
  
  local_70 = (psa_key_slot_t *)0x0;
  local_88 = (psa_key_slot_t *)0x0;
  local_68._0_2_ = (specified_attributes->core).type;
  local_68._2_2_ = (specified_attributes->core).bits;
  local_68._4_4_ = (specified_attributes->core).lifetime;
  uStack_60._0_4_ = (specified_attributes->core).id;
  uStack_60._4_4_ = (specified_attributes->core).policy.usage;
  local_58._0_4_ = (specified_attributes->core).policy.alg;
  local_58._4_4_ = (specified_attributes->core).policy.alg2;
  uStack_50 = *(undefined8 *)&(specified_attributes->core).flags;
  local_48 = specified_attributes->domain_parameters;
  sStack_40 = specified_attributes->domain_parameters_size;
  local_78 = (psa_key_slot_t *)0x0;
  pVar3 = psa_get_key_from_slot(source_handle,&local_70,2,0);
  source = local_70;
  if ((pVar3 == 0) &&
     (pVar3 = psa_validate_optional_attributes(local_70,specified_attributes), pVar3 == 0)) {
    pVar2 = (psa_algorithm_t)local_58;
    alg2 = (source->attr).policy.alg;
    pVar4 = psa_key_policy_algorithm_intersection((psa_algorithm_t)local_58,alg2);
    alg2_00 = (source->attr).policy.alg2;
    local_7c = local_58._4_4_;
    pVar5 = psa_key_policy_algorithm_intersection(local_58._4_4_,alg2_00);
    pVar3 = -0x87;
    if ((alg2 == 0) || ((pVar2 == 0 || (pVar4 != 0)))) {
      bVar1 = false;
      if ((alg2_00 == 0) || ((local_7c == 0 || (pVar5 != 0)))) {
        uStack_60 = CONCAT44(uStack_60._4_4_ & (source->attr).policy.usage,(undefined4)uStack_60);
        local_58 = CONCAT44(pVar5,pVar4);
        bVar1 = true;
        pVar3 = 0;
      }
    }
    else {
      bVar1 = false;
    }
    if (((bVar1) &&
        (pVar3 = psa_start_key_creation
                           ((psa_key_creation_method_t)&local_68,
                            (psa_key_attributes_t *)target_handle,(psa_key_handle_t *)&local_88,
                            &local_78,in_R8), pVar3 == 0)) &&
       (driver_00 = local_88, pVar3 = psa_copy_key_material(source,local_88), pVar3 == 0)) {
      pVar3 = psa_finish_key_creation(local_88,(psa_se_drv_table_entry_t *)driver_00);
    }
  }
  if (pVar3 != 0) {
    if (local_88 != (psa_key_slot_t *)0x0) {
      psa_wipe_key_slot(local_88);
    }
    *target_handle = 0;
  }
  return pVar3;
}

Assistant:

psa_status_t psa_copy_key( psa_key_handle_t source_handle,
                           const psa_key_attributes_t *specified_attributes,
                           psa_key_handle_t *target_handle )
{
    psa_status_t status;
    psa_key_slot_t *source_slot = NULL;
    psa_key_slot_t *target_slot = NULL;
    psa_key_attributes_t actual_attributes = *specified_attributes;
    psa_se_drv_table_entry_t *driver = NULL;

    status = psa_get_transparent_key( source_handle, &source_slot,
                                      PSA_KEY_USAGE_COPY, 0 );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_validate_optional_attributes( source_slot,
                                               specified_attributes );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_restrict_key_policy( &actual_attributes.core.policy,
                                      &source_slot->attr.policy );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_start_key_creation( PSA_KEY_CREATION_COPY,
                                     &actual_attributes,
                                     target_handle, &target_slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        /* Copying to a secure element is not implemented yet. */
        status = PSA_ERROR_NOT_SUPPORTED;
        goto exit;
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    status = psa_copy_key_material( source_slot, target_slot );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_finish_key_creation( target_slot, driver );
exit:
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( target_slot, driver );
        *target_handle = 0;
    }
    return( status );
}